

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeDatabase(Parse *pParse,int iDb)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Table *pTab;
  int iTab;
  int iMem;
  int iStatCur;
  HashElem *k;
  Schema *pSchema;
  sqlite3 *db;
  int in_stack_00000064;
  int in_stack_00000068;
  int in_stack_0000006c;
  Index *in_stack_00000070;
  Table *in_stack_00000078;
  Parse *in_stack_00000080;
  int in_stack_ffffffffffffffbc;
  Parse *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  undefined8 *local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(*(long *)(*in_RDI + 0x20) + (long)in_ESI * 0x20 + 0x18);
  sqlite3BeginWriteOperation((Parse *)&DAT_aaaaaaaaaaaaaaaa,-0x55555556,in_stack_ffffffffffffffc8);
  *(int *)(in_RDI + 7) = (int)in_RDI[7] + 3;
  openStatTable((Parse *)pTab,unaff_retaddr_00,unaff_retaddr,(char *)in_RDI,
                (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  for (local_28 = *(undefined8 **)(lVar1 + 0x10); local_28 != (undefined8 *)0x0;
      local_28 = (undefined8 *)*local_28) {
    in_stack_ffffffffffffffc0 = (Parse *)local_28[2];
    analyzeOneTable(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c,
                    in_stack_00000068,in_stack_00000064);
  }
  loadAnalysis(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

static void analyzeDatabase(Parse *pParse, int iDb){
  sqlite3 *db = pParse->db;
  Schema *pSchema = db->aDb[iDb].pSchema;    /* Schema of database iDb */
  HashElem *k;
  int iStatCur;
  int iMem;
  int iTab;

  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  openStatTable(pParse, iDb, iStatCur, 0, 0);
  iMem = pParse->nMem+1;
  iTab = pParse->nTab;
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(k=sqliteHashFirst(&pSchema->tblHash); k; k=sqliteHashNext(k)){
    Table *pTab = (Table*)sqliteHashData(k);
    analyzeOneTable(pParse, pTab, 0, iStatCur, iMem, iTab);
#ifdef SQLITE_ENABLE_STAT4
    iMem = sqlite3FirstAvailableRegister(pParse, iMem);
#else
    assert( iMem==sqlite3FirstAvailableRegister(pParse,iMem) );
#endif
  }
  loadAnalysis(pParse, iDb);
}